

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_env.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string example;
  ostringstream ss;
  char penv [256];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&example,anon_var_dwarf_239a,(allocator<char> *)&ss);
  memset(penv,0,0x100);
  std::operator+(&local_2e0,"NOWIDE_TEST2=",&example);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&local_2e0
                 ,"x");
  strncpy(penv,_ss,0xff);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&local_2e0);
  iVar2 = setenv("NOWIDE_TEST1",example._M_dataplus._M_p,1);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,
                             "Error nowide::setenv(\"NOWIDE_TEST1\",example.c_str(),1)==0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1d);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST1");
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST1\") in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(pcVar3,&example);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST1\")==example in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1f);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = setenv("NOWIDE_TEST1","xx",0);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::setenv(\"NOWIDE_TEST1\",\"xx\",0)==0 in "
                            );
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x20);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST1");
  bVar1 = std::operator==(pcVar3,&example);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST1\")==example in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x21);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = putenv(penv);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::putenv(penv)==0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x22);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar3 = getenv("NOWIDE_TEST2");
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST2\") in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x23);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar4 = getenv("NOWIDE_TEST_INVALID");
  if (pcVar4 == (char *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,&example
                   ,"x");
    bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&example);
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    poVar5 = std::operator<<((ostream *)&ss,
                             "Error nowide::getenv(\"NOWIDE_TEST2\")==example + \"x\" in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x25);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar5 = std::operator<<((ostream *)&ss,"Error nowide::getenv(\"NOWIDE_TEST_INVALID\")==0 in ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_env.cpp"
                          );
  poVar5 = std::operator<<(poVar5,':');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x24);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"main");
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,(string *)&local_2e0);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        char penv[256] = {0};
        strncpy(penv,("NOWIDE_TEST2=" + example + "x").c_str(),sizeof(penv)-1);
        
        TEST(nowide::setenv("NOWIDE_TEST1",example.c_str(),1)==0);
        TEST(nowide::getenv("NOWIDE_TEST1"));
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::setenv("NOWIDE_TEST1","xx",0)==0);
        TEST(nowide::getenv("NOWIDE_TEST1")==example);
        TEST(nowide::putenv(penv)==0);
        TEST(nowide::getenv("NOWIDE_TEST2"));
        TEST(nowide::getenv("NOWIDE_TEST_INVALID")==0);
        TEST(nowide::getenv("NOWIDE_TEST2")==example + "x");
        
        std::cout << "Ok" << std::endl;
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}